

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

Vec_Ptr_t * Io_NtkOrderingPads(Abc_Ntk_t *pNtk,Vec_Ptr_t *vTerms)

{
  uint numTerms_00;
  uint uVar1;
  int iVar2;
  int *pOrdered_00;
  Vec_Ptr_t *p;
  ProgressBar *p_00;
  Abc_Obj_t *pObj;
  bool bVar3;
  uint local_5c;
  Abc_Obj_t *pAStack_58;
  uint i;
  Abc_Obj_t *pNextTerm;
  Abc_Obj_t *pNeighbor;
  Vec_Ptr_t *vOrderedTerms;
  int newNeighbor;
  int *pOrdered;
  uint local_28;
  uint termCount;
  uint termIdx;
  uint numTerms;
  ProgressBar *pProgress;
  Vec_Ptr_t *vTerms_local;
  Abc_Ntk_t *pNtk_local;
  
  numTerms_00 = Vec_PtrSize(vTerms);
  pOrdered._4_4_ = 0;
  pOrdered_00 = (int *)malloc((ulong)numTerms_00 << 2);
  bVar3 = true;
  p = Vec_PtrAlloc(numTerms_00);
  for (local_5c = 0; local_5c < numTerms_00; local_5c = local_5c + 1) {
    pOrdered_00[local_5c] = 0;
  }
  pAStack_58 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,0);
  p_00 = Extra_ProgressBarStart(_stdout,numTerms_00);
  local_28 = 1;
  while (pOrdered._4_4_ < numTerms_00 && local_28 < numTerms_00) {
    uVar1 = Abc_ObjId(pAStack_58);
    if ((pOrdered_00[uVar1] == 0) || (bVar3)) {
      iVar2 = Vec_PtrPushUnique(p,pAStack_58);
      if (iVar2 == 0) {
        uVar1 = Abc_ObjId(pAStack_58);
        pOrdered_00[uVar1] = 1;
        pOrdered._4_4_ = pOrdered._4_4_ + 1;
      }
      pObj = Io_NtkBfsPads(pNtk,pAStack_58,numTerms_00,pOrdered_00);
      iVar2 = Vec_PtrPushUnique(p,pObj);
      bVar3 = iVar2 == 0;
      if (bVar3) {
        uVar1 = Abc_ObjId(pObj);
        pOrdered_00[uVar1] = 1;
        pOrdered._4_4_ = pOrdered._4_4_ + 1;
        pAStack_58 = pObj;
      }
      else if (local_28 < numTerms_00) {
        pAStack_58 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,local_28);
        local_28 = local_28 + 1;
      }
      Extra_ProgressBarUpdate(p_00,pOrdered._4_4_,(char *)0x0);
    }
    else {
      pAStack_58 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,local_28);
      local_28 = local_28 + 1;
    }
  }
  Extra_ProgressBarStop(p_00);
  if (pOrdered._4_4_ == numTerms_00) {
    return p;
  }
  __assert_fail("termCount==numTerms",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                ,0x2fc,"Vec_Ptr_t *Io_NtkOrderingPads(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Io_NtkOrderingPads( Abc_Ntk_t * pNtk, Vec_Ptr_t * vTerms )
{ 
    ProgressBar * pProgress;
    unsigned numTerms=Vec_PtrSize(vTerms); 
    unsigned termIdx=0, termCount=0;
    int * pOrdered = ABC_ALLOC(int, numTerms); 
    int newNeighbor=1;
    Vec_Ptr_t * vOrderedTerms = Vec_PtrAlloc ( numTerms );
    Abc_Obj_t * pNeighbor = NULL, * pNextTerm;     
    unsigned i; 

    for( i=0 ; i<numTerms ; i++ )
	pOrdered[i]=0; 
   
    pNextTerm = (Abc_Obj_t *)Vec_PtrEntry(vTerms, termIdx++);
    pProgress = Extra_ProgressBarStart( stdout, numTerms );
    while( termCount < numTerms && termIdx < numTerms )
    {
	if( pOrdered[Abc_ObjId(pNextTerm)] && !newNeighbor )
	{
	    pNextTerm = (Abc_Obj_t *)Vec_PtrEntry( vTerms, termIdx++ );
	    continue;
	}
	if(!Vec_PtrPushUnique( vOrderedTerms, pNextTerm ))
	{
	    pOrdered[Abc_ObjId(pNextTerm)]=1;
	    termCount++; 
	}
	pNeighbor=Io_NtkBfsPads( pNtk, pNextTerm, numTerms, pOrdered );
	if( (newNeighbor=!Vec_PtrPushUnique( vOrderedTerms, pNeighbor )) )
	{
	   pOrdered[Abc_ObjId(pNeighbor)]=1;
	   termCount++;
	   pNextTerm=pNeighbor;
	}
	else if(termIdx < numTerms)
	    pNextTerm = (Abc_Obj_t *)Vec_PtrEntry( vTerms, termIdx++ );

	Extra_ProgressBarUpdate( pProgress, termCount, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    assert(termCount==numTerms);
    return vOrderedTerms;
}